

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

QCGroup * __thiscall
obx::anon_unknown_3::QCGroup::copyThisAndPush
          (QCGroup *__return_storage_ptr__,QCGroup *this,QueryCondition *other)

{
  pointer __first;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ulong uVar2;
  pointer __result;
  pointer psVar3;
  pointer psVar4;
  ulong uVar5;
  _Tp_alloc_type *__alloc;
  long lVar6;
  _Head_base<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_false> *__r;
  _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  *this_00;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> local_48;
  _Head_base<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_false> local_38;
  
  QCGroup(__return_storage_ptr__,this);
  (*other->_vptr_QueryCondition[5])(&local_38,other);
  __r = &local_38;
  std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>::
  shared_ptr<obx::(anonymous_namespace)::QueryCondition,std::default_delete<obx::(anonymous_namespace)::QueryCondition>,void>
            (&local_48,
             (unique_ptr<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
              *)__r);
  _Var1._M_pi = local_48.
                super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  psVar4 = (__return_storage_ptr__->conditions_).
           super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 == (__return_storage_ptr__->conditions_).
                super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (__return_storage_ptr__->conditions_).
              super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)psVar4 - (long)__first;
    if (lVar6 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar2 = lVar6 >> 4;
    uVar5 = 1;
    if (psVar4 != __first) {
      uVar5 = uVar2;
    }
    this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
               *)(uVar5 + uVar2);
    if ((_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
         *)0x7fffffffffffffe < this_00) {
      this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 *)0x7ffffffffffffff;
    }
    __alloc = (_Tp_alloc_type *)(uVar5 + uVar2);
    if (CARRY8(uVar5,uVar2)) {
      this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 *)0x7ffffffffffffff;
    }
    __result = std::
               _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
               ::_M_allocate(this_00,(size_t)__r);
    _Var1._M_pi = local_48.
                  super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)((long)__result + lVar6) =
         local_48.
         super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    ((undefined8 *)((long)__result + lVar6))[1] = _Var1._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    psVar3 = std::
             vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
             ::_S_relocate(__first,psVar4,__result,__alloc);
    psVar4 = std::
             vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
             ::_S_relocate(psVar4,psVar4,psVar3 + 1,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar4;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    (psVar4->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar4->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = local_48.
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (psVar4->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = _Var1._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar4 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.
              super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (local_38._M_head_impl != (QueryCondition *)0x0) {
    (*(local_38._M_head_impl)->_vptr_QueryCondition[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

QCGroup copyThisAndPush(const QueryCondition& other) {
        QCGroup copy(*this);
        copy.conditions_.push_back(internalCopyAsPtr(other));
        return copy;
    }